

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O0

void duckdb::TernaryExecutor::
     ExecuteGeneric<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_long_string_t_timestamp_t_timestamp_t_ValidityMask_ptr_unsigned_long *fun)

{
  string_t a_00;
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  ValidityMask *cdata_00;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  UnifiedVectorFormat cdata_1;
  UnifiedVectorFormat bdata_1;
  UnifiedVectorFormat adata_1;
  ValidityMask *result_validity;
  long *result_data;
  timestamp_t *cdata;
  timestamp_t *bdata;
  string_t *adata;
  ValidityMask *in_stack_fffffffffffffdf8;
  _func_long_string_t_timestamp_t_timestamp_t_ValidityMask_ptr_unsigned_long
  *in_stack_fffffffffffffe00;
  timestamp_t in_stack_fffffffffffffe08;
  timestamp_t in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  idx_t in_stack_fffffffffffffe30;
  SelectionVector *asel;
  undefined1 *count_00;
  long *result_data_00;
  UnifiedVectorFormat *in_stack_fffffffffffffe78;
  UnifiedVectorFormat *bdata_00;
  string_t *in_stack_fffffffffffffe80;
  long local_178;
  SelectionVector *in_stack_fffffffffffffe90;
  SelectionVector *in_stack_fffffffffffffe98;
  ValidityMask *in_stack_fffffffffffffea0;
  ValidityMask *in_stack_fffffffffffffea8;
  ValidityMask *in_stack_fffffffffffffeb0;
  ValidityMask *in_stack_fffffffffffffeb8;
  _func_long_string_t_timestamp_t_timestamp_t_ValidityMask_ptr_unsigned_long
  *in_stack_fffffffffffffec0;
  UnifiedVectorFormat local_130 [16];
  undefined1 local_120 [56];
  UnifiedVectorFormat local_e8 [16];
  SelectionVector local_d8 [2];
  int64_t local_a0;
  int64_t local_98;
  undefined8 local_90;
  char *local_88;
  ValidityMask *local_80;
  long *local_78;
  timestamp_t *local_70;
  timestamp_t *local_68;
  string_t *local_60;
  UnifiedVectorFormat *local_50;
  Vector *local_48;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (((VVar1 == CONSTANT_VECTOR) &&
      (VVar1 = Vector::GetVectorType(local_38), VVar1 == CONSTANT_VECTOR)) &&
     (VVar1 = Vector::GetVectorType(local_40), VVar1 == CONSTANT_VECTOR)) {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    bVar2 = ConstantVector::IsNull((Vector *)0xc5b73e);
    if (((bVar2) || (bVar2 = ConstantVector::IsNull((Vector *)0xc5b74f), bVar2)) ||
       (bVar2 = ConstantVector::IsNull((Vector *)0xc5b760), bVar2)) {
      duckdb::ConstantVector::SetNull(local_48,true);
    }
    else {
      local_60 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xc5b78a);
      local_68 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0xc5b79f);
      local_70 = ConstantVector::GetData<duckdb::timestamp_t>((Vector *)0xc5b7b4);
      local_78 = ConstantVector::GetData<long>((Vector *)0xc5b7c9);
      local_80 = ConstantVector::Validity(local_48);
      local_90 = *(undefined8 *)&local_60->value;
      local_88 = (local_60->value).pointer.ptr;
      local_98 = local_68->value;
      local_a0 = local_70->value;
      a_00.value.pointer.ptr = (char *)in_stack_fffffffffffffe20;
      a_00.value._0_8_ = in_stack_fffffffffffffe18;
      lVar3 = TernaryLambdaWrapperWithNulls::
              Operation<long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long),duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>
                        (in_stack_fffffffffffffe00,a_00,in_stack_fffffffffffffe10,
                         in_stack_fffffffffffffe08,in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffe30);
      *local_78 = lVar3;
    }
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_48);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_e8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_130);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)&stack0xfffffffffffffe78);
    duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_38,local_50);
    duckdb::Vector::ToUnifiedFormat((ulong)local_40,local_50);
    UnifiedVectorFormat::GetData<duckdb::string_t>(local_e8);
    UnifiedVectorFormat::GetData<duckdb::timestamp_t>(local_130);
    UnifiedVectorFormat::GetData<duckdb::timestamp_t>
              ((UnifiedVectorFormat *)&stack0xfffffffffffffe78);
    FlatVector::GetData<long>((Vector *)0xc5b957);
    asel = local_d8;
    count_00 = local_120;
    result_data_00 = &local_178;
    bdata_00 = in_stack_fffffffffffffe78;
    cdata_00 = FlatVector::Validity((Vector *)0xc5b9cd);
    ExecuteLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (in_stack_fffffffffffffe80,(timestamp_t *)bdata_00,(timestamp_t *)cdata_00,
               result_data_00,(idx_t)count_00,asel,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe78);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe78);
    UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffe78);
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}